

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O3

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_neighbours
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Vertex_handle v,Simplex *n,bool keep_only_superior)

{
  _Rb_tree_color _Var1;
  pointer psVar2;
  undefined8 in_RAX;
  _Base_ptr p_Var3;
  Vertex_handle *__v;
  _Base_ptr p_Var4;
  undefined8 local_38;
  
  psVar2 = (this->skeleton).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (_Base_ptr)((long)&psVar2[v.vertex].super_StoredVertex.m_out_edges._M_t + 8);
  p_Var3 = *(_Base_ptr *)((long)&psVar2[v.vertex].super_StoredVertex.m_out_edges._M_t + 0x18);
  if (p_Var3 != p_Var4) {
    local_38 = in_RAX;
    do {
      _Var1 = p_Var3[1]._M_color;
      if (keep_only_superior) {
        if (v.vertex < (int)_Var1) {
          local_38 = CONCAT44(local_38._4_4_,_Var1);
          __v = (Vertex_handle *)&local_38;
          goto LAB_0011071f;
        }
      }
      else {
        local_38 = CONCAT44(_Var1,local_38._0_4_);
        __v = (Vertex_handle *)((long)&local_38 + 4);
LAB_0011071f:
        std::
        _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
        ::
        _M_insert_unique<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const&>
                  ((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                    *)n,__v);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var4);
  }
  return;
}

Assistant:

virtual void add_neighbours(Vertex_handle v, Simplex & n,
                              bool keep_only_superior = false) const {
    boost_adjacency_iterator ai, ai_end;
    for (tie(ai, ai_end) = adjacent_vertices(v.vertex, skeleton); ai != ai_end;
         ++ai) {
      Vertex_handle value(*ai);
      if (keep_only_superior) {
        if (value > v.vertex) {
          n.add_vertex(value);
        }
      } else {
        n.add_vertex(value);
      }
    }
  }